

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property_value::resolve_type(property_value *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  byte *pbVar7;
  iterator iStack_38;
  uchar i;
  iterator __end3;
  iterator __begin3;
  byte_buffer *__range3;
  int iStack_18;
  bool lastWasNull;
  int bytes;
  int nuls;
  bool is_all_printable;
  property_value *this_local;
  
  if (this->type == UNKNOWN) {
    bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->byte_data);
    if (bVar3) {
      this->type = STRING;
    }
    else {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back(&this->byte_data);
      if (*pvVar6 == '\0') {
        bVar3 = true;
        iStack_18 = 0;
        __range3._4_4_ = 0;
        bVar2 = false;
        __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->byte_data)
        ;
        iStack_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (&this->byte_data);
        while (bVar4 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc8), bVar4) {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&__end3);
          bVar1 = *pbVar7;
          __range3._4_4_ = __range3._4_4_ + 1;
          bVar4 = true;
          if (bVar1 != 0) {
            iVar5 = isprint((uint)bVar1);
            bVar4 = iVar5 != 0;
          }
          bVar3 = (bool)(bVar3 & bVar4);
          if (bVar1 == 0) {
            if (bVar2) {
              this->type = BINARY;
              return;
            }
            iStack_18 = iStack_18 + 1;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          if (!bVar3) break;
          __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator++(&__end3);
        }
        if (((bVar3) && (iStack_18 < __range3._4_4_)) || (__range3._4_4_ == 0)) {
          this->type = STRING;
          if (iStack_18 < 2) {
            return;
          }
          this->type = STRING_LIST;
          return;
        }
      }
      this->type = BINARY;
    }
  }
  return;
}

Assistant:

void
property_value::resolve_type()
{
	if (type != UNKNOWN)
	{
		return;
	}
	if (byte_data.empty())
	{
		type = STRING;
		return;
	}
	if (byte_data.back() == 0)
	{
		bool is_all_printable = true;
		int nuls = 0;
		int bytes = 0;
		bool lastWasNull = false;
		for (auto i : byte_data)
		{
			bytes++;
			is_all_printable &= (i == '\0') || isprint(i);
			if (i == '\0')
			{
				// If there are two nulls in a row, then we're probably binary.
				if (lastWasNull)
				{
					type = BINARY;
					return;
				}
				nuls++;
				lastWasNull = true;
			}
			else
			{
				lastWasNull = false;
			}
			if (!is_all_printable)
			{
				break;
			}
		}
		if ((is_all_printable && (bytes > nuls)) || bytes == 0)
		{
			type = STRING;
			if (nuls > 1)
			{
				type = STRING_LIST;
			}
			return;
		}
	}
	type = BINARY;
}